

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSurfacelessContextTests.cpp
# Opt level: O0

int __thiscall
deqp::egl::SurfacelessContextTests::init(SurfacelessContextTests *this,EVP_PKEY_CTX *ctx)

{
  EglTestContext *eglTestCtx;
  bool bVar1;
  int extraout_EAX;
  TestNode *node;
  pointer pNVar2;
  char *name;
  char *description;
  reference filters;
  __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
  local_68;
  __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
  local_60;
  __normal_iterator<const_deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
  local_58;
  const_iterator i;
  FilterList local_40;
  undefined1 local_28 [8];
  vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> filterLists;
  SurfacelessContextTests *this_local;
  
  filterLists.
  super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::vector
            ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *)
             local_28);
  eglu::FilterList::FilterList(&local_40);
  getDefaultFilterLists
            ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *)
             local_28,&local_40);
  eglu::FilterList::~FilterList(&local_40);
  local_60._M_current =
       (NamedFilterList *)
       std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::begin
                 ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *
                  )local_28);
  __gnu_cxx::
  __normal_iterator<deqp::egl::NamedFilterList_const*,std::vector<deqp::egl::NamedFilterList,std::allocator<deqp::egl::NamedFilterList>>>
  ::__normal_iterator<deqp::egl::NamedFilterList*>
            ((__normal_iterator<deqp::egl::NamedFilterList_const*,std::vector<deqp::egl::NamedFilterList,std::allocator<deqp::egl::NamedFilterList>>>
              *)&local_58,&local_60);
  while( true ) {
    local_68._M_current =
         (NamedFilterList *)
         std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::end
                   ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
                     *)local_28);
    bVar1 = __gnu_cxx::operator!=(&local_58,&local_68);
    if (!bVar1) break;
    node = (TestNode *)operator_new(0xb8);
    eglTestCtx = (this->super_TestCaseGroup).m_eglTestCtx;
    pNVar2 = __gnu_cxx::
             __normal_iterator<const_deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
             ::operator->(&local_58);
    name = NamedFilterList::getName(pNVar2);
    pNVar2 = __gnu_cxx::
             __normal_iterator<const_deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
             ::operator->(&local_58);
    description = NamedFilterList::getDescription(pNVar2);
    filters = __gnu_cxx::
              __normal_iterator<const_deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
              ::operator*(&local_58);
    egl::anon_unknown_0::SurfacelessContextCase::SurfacelessContextCase
              ((SurfacelessContextCase *)node,eglTestCtx,name,description,&filters->super_FilterList
              );
    tcu::TestNode::addChild((TestNode *)this,node);
    __gnu_cxx::
    __normal_iterator<const_deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
    ::operator++(&local_58,0);
  }
  std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::~vector
            ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *)
             local_28);
  return extraout_EAX;
}

Assistant:

void SurfacelessContextTests::init (void)
{
	vector<NamedFilterList>	filterLists;
	getDefaultFilterLists(filterLists, eglu::FilterList());

	for (vector<NamedFilterList>::const_iterator i = filterLists.begin(); i != filterLists.end(); i++)
		addChild(new SurfacelessContextCase(m_eglTestCtx, i->getName(), i->getDescription(), *i));
}